

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::chStOfLagrangian(KktCheck *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  int *in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  double extraout_XMM0_Qa;
  double lagrV;
  bool istrue;
  double local_18;
  
  bVar3 = true;
  in_RDI[0x45] = 0;
  while (in_RDI[0x45] < *in_RDI) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),
                        (long)in_RDI[0x45]);
    local_18 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                        (long)in_RDI[0x45]);
    local_18 = local_18 - *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_RDI[0x45]);
    in_RDI[0x46] = *pvVar5;
    while( true ) {
      iVar2 = in_RDI[0x46];
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 2);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(in_RDI[0x45] + 1));
      if (*pvVar5 <= iVar2) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_RDI[0x46]);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),(long)*pvVar5);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                          (long)in_RDI[0x46]);
      local_18 = dVar1 * *pvVar4 + local_18;
      in_RDI[0x46] = in_RDI[0x46] + 1;
    }
    std::abs((int)this_00);
    if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa &&
        extraout_XMM0_Qa != *(double *)(in_RDI + 0x48)) {
      if (in_RDI[0x58] == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Column ");
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),(long)in_RDI[0x45])
        ;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
        poVar6 = std::operator<<(poVar6," fails stationary of Lagrangian: dL/dx");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_RDI[0x45]);
        poVar6 = std::operator<<(poVar6," = ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
        poVar6 = std::operator<<(poVar6,", rather than zero.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = false;
    }
    in_RDI[0x45] = in_RDI[0x45] + 1;
  }
  if (bVar3) {
    if (in_RDI[0x58] == 1) {
      std::operator<<((ostream *)&std::cout,"Stationarity of Lagrangian.\n");
    }
  }
  else {
    if (in_RDI[0x58] == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Lagrangian is not stationary.\n");
    }
    *(undefined1 *)(in_RDI + 0x4a) = 1;
  }
  return;
}

Assistant:

void KktCheck::chStOfLagrangian() {
	bool istrue = true;
	double lagrV;
	//A'y + c - z = 0
	for (j=0; j<numCol;j++) {
		lagrV = colCost[j] -colDual[j];
		for (k=Astart[j]; k<Astart[j+1]; k++) 
				lagrV = lagrV + rowDual[Aindex[k]]*Avalue[k];
				
		if (abs(lagrV) > tol) {
			if (print == 1) 
				cout<<"Column "<<cIndexRev[j]<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
				//cout<<"Column "<<j<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
			istrue = false;
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Stationarity of Lagrangian.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Lagrangian is not stationary.\n";
		istrueGlb = true;
	}

}